

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O2

void __thiscall hmi::renderer::draw_circle(renderer *this,vec2f center,float radius,color4f color)

{
  undefined1 auVar1 [16];
  vec<float,_2UL> vVar2;
  undefined8 *puVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  vertex vertices [50];
  
  puVar3 = (undefined8 *)((long)&vertices[0].color.field_0 + 8);
  for (lVar4 = 0; lVar4 != 0x32; lVar4 = lVar4 + 1) {
    fVar5 = ((float)(int)lVar4 * 6.2831855) / 50.0;
    fVar6 = sinf(fVar5);
    fVar5 = cosf(fVar5);
    vVar2.field_0.data[1] = fVar5;
    vVar2.field_0.data[0] = fVar6;
    vVar2 = operator*(radius,vVar2);
    vVar2 = operator+((vec<float,_2UL>)center.field_0,vVar2);
    auVar1._8_4_ = color.field_0._0_4_;
    auVar1._0_8_ = vVar2.field_0;
    auVar1._12_4_ = color.field_0._4_4_;
    *(undefined1 (*) [16])(puVar3 + -2) = auVar1;
    *puVar3 = color.field_0._8_8_;
    puVar3 = puVar3 + 3;
  }
  draw(this,vertices,0x32,2);
  return;
}

Assistant:

void renderer::draw_circle(vec2f center, float radius, color4f color) {
    static constexpr int POINT_COUNT = 50;
    static constexpr float PI = 3.14159265359f;

    vertex vertices[POINT_COUNT];

    for (int i = 0; i < POINT_COUNT; ++i) {
      float angle = 2 * PI * i / POINT_COUNT;
      vertices[i].position = center + radius * vec2f(std::sin(angle), std::cos(angle));
      vertices[i].color = color;
    }

    draw(&vertices[0], POINT_COUNT, GL_LINE_LOOP);
  }